

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AddCompileOptions
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *lang,
          string *config)

{
  _Rb_tree_node_base *__lhs;
  cmMakefile *this_00;
  cmGeneratorTarget *this_01;
  bool bVar1;
  char *pcVar2;
  _Rb_tree_node_base *p_Var3;
  ostream *poVar4;
  string *psVar5;
  pointer pbVar6;
  allocator local_229;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  features;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  cmGeneratorTarget *local_1e8;
  string *local_1e0;
  char *local_1d8;
  _Rb_tree_node_base *local_1d0;
  string langFlagRegexVar;
  RegularExpression r;
  
  std::__cxx11::string::string((string *)&local_208,"CMAKE_",(allocator *)&features);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&r,&local_208,
                 lang);
  std::operator+(&langFlagRegexVar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&r,
                 "_FLAG_REGEX");
  std::__cxx11::string::~string((string *)&r);
  std::__cxx11::string::~string((string *)&local_208);
  pcVar2 = cmMakefile::GetDefinition(this->Makefile,&langFlagRegexVar);
  local_1e8 = target;
  if (pcVar2 == (char *)0x0) {
    std::__cxx11::string::string((string *)&r,"COMPILE_FLAGS",(allocator *)&local_208);
    pcVar2 = cmGeneratorTarget::GetProperty(target,(string *)&r);
    std::__cxx11::string::~string((string *)&r);
    if (pcVar2 != (char *)0x0) {
      (*this->_vptr_cmLocalGenerator[6])(this,flags,pcVar2);
    }
    r.startp[0] = (char *)0x0;
    r.startp[1] = (char *)0x0;
    r.startp[2] = (char *)0x0;
    cmGeneratorTarget::GetCompileOptions
              (target,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&r,config,lang);
    for (pcVar2 = r.startp[0]; pcVar2 != r.startp[1]; pcVar2 = pcVar2 + 0x20) {
      (*this->_vptr_cmLocalGenerator[7])(this,flags,pcVar2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&r);
  }
  else {
    cmsys::RegularExpression::RegularExpression(&r,pcVar2);
    features.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    features.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    features.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&local_208,"COMPILE_FLAGS",&local_229);
    pcVar2 = cmGeneratorTarget::GetProperty(target,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    if (pcVar2 != (char *)0x0) {
      cmSystemTools::ParseWindowsCommandLine(pcVar2,&features);
    }
    cmGeneratorTarget::GetCompileOptions(target,&features,config,lang);
    for (pbVar6 = features.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar6 != features.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
      bVar1 = cmsys::RegularExpression::find(&r,(pbVar6->_M_dataplus)._M_p);
      if (bVar1) {
        (*this->_vptr_cmLocalGenerator[7])(this,flags,pbVar6);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&features);
    cmsys::RegularExpression::~RegularExpression(&r);
    target = local_1e8;
  }
  features.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  features.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  features.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetCompileFeatures(target,&features,config);
  pbVar6 = features.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pbVar6 == features.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      p_Var3 = (target->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_1d0 = &(target->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header._M_header;
      local_1e0 = lang;
      goto LAB_002e5f5c;
    }
    bVar1 = cmMakefile::AddRequiredTargetFeature(this->Makefile,target->Target,pbVar6,(string *)0x0)
    ;
    pbVar6 = pbVar6 + 1;
  } while (bVar1);
LAB_002e6105:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&features);
  std::__cxx11::string::~string((string *)&langFlagRegexVar);
  return;
LAB_002e5f5c:
  if (p_Var3 == local_1d0) goto LAB_002e5ff5;
  __lhs = p_Var3 + 1;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&r,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 "_STANDARD");
  pcVar2 = cmGeneratorTarget::GetProperty(target,(string *)&r);
  std::__cxx11::string::~string((string *)&r);
  if (pcVar2 != (char *)0x0) {
    this_00 = this->Makefile;
    local_1d8 = pcVar2;
    std::__cxx11::string::string((string *)&r,pcVar2,(allocator *)&local_208);
    bVar1 = cmMakefile::IsLaterStandard(this_00,(string *)__lhs,(string *)&r,(string *)(p_Var3 + 2))
    ;
    std::__cxx11::string::~string((string *)&r);
    this_01 = local_1e8;
    target = local_1e8;
    if (bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&r);
      poVar4 = std::operator<<((ostream *)&r,"The COMPILE_FEATURES property of target \"");
      pcVar2 = local_1d8;
      psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this_01);
      poVar4 = std::operator<<(poVar4,(string *)psVar5);
      poVar4 = std::operator<<(poVar4,
                               "\" was evaluated when computing the link implementation, and the \""
                              );
      poVar4 = std::operator<<(poVar4,(string *)__lhs);
      poVar4 = std::operator<<(poVar4,"_STANDARD\" was \"");
      poVar4 = std::operator<<(poVar4,(string *)(p_Var3 + 2));
      poVar4 = std::operator<<(poVar4,
                               "\" for that computation.  Computing the COMPILE_FEATURES based on the link implementation resulted in a higher \""
                              );
      poVar4 = std::operator<<(poVar4,(string *)__lhs);
      poVar4 = std::operator<<(poVar4,"_STANDARD\" \"");
      poVar4 = std::operator<<(poVar4,pcVar2);
      poVar4 = std::operator<<(poVar4,
                               "\".  This is not permitted. The COMPILE_FEATURES may not both depend on and be depended on by the link implementation."
                              );
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::stringbuf::str();
      IssueMessage(this,FATAL_ERROR,&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&r);
      goto LAB_002e6105;
    }
  }
  p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  goto LAB_002e5f5c;
LAB_002e5ff5:
  AddCompilerRequirementFlag(this,flags,target,local_1e0);
  goto LAB_002e6105;
}

Assistant:

void cmLocalGenerator::AddCompileOptions(
  std::string& flags, cmGeneratorTarget* target,
  const std::string& lang, const std::string& config
  )
{
  std::string langFlagRegexVar = std::string("CMAKE_")+lang+"_FLAG_REGEX";

  if(const char* langFlagRegexStr =
     this->Makefile->GetDefinition(langFlagRegexVar))
    {
    // Filter flags acceptable to this language.
    cmsys::RegularExpression r(langFlagRegexStr);
    std::vector<std::string> opts;
    if(const char* targetFlags = target->GetProperty("COMPILE_FLAGS"))
      {
      cmSystemTools::ParseWindowsCommandLine(targetFlags, opts);
      }
    target->GetCompileOptions(opts, config, lang);
    for(std::vector<std::string>::const_iterator i = opts.begin();
        i != opts.end(); ++i)
      {
      if(r.find(i->c_str()))
        {
        // (Re-)Escape this flag.  COMPILE_FLAGS were already parsed
        // as a command line above, and COMPILE_OPTIONS are escaped.
        this->AppendFlagEscape(flags, *i);
        }
      }
    }
  else
    {
    // Use all flags.
    if(const char* targetFlags = target->GetProperty("COMPILE_FLAGS"))
      {
      // COMPILE_FLAGS are not escaped for historical reasons.
      this->AppendFlags(flags, targetFlags);
      }
    std::vector<std::string> opts;
    target->GetCompileOptions(opts, config, lang);
    for(std::vector<std::string>::const_iterator i = opts.begin();
        i != opts.end(); ++i)
      {
      // COMPILE_OPTIONS are escaped.
      this->AppendFlagEscape(flags, *i);
      }
    }
  std::vector<std::string> features;
  target->GetCompileFeatures(features, config);
  for(std::vector<std::string>::const_iterator it = features.begin();
      it != features.end(); ++it)
    {
     if (!this->Makefile->AddRequiredTargetFeature(target->Target, *it))
      {
      return;
      }
    }

  for(std::map<std::string, std::string>::const_iterator it
      = target->GetMaxLanguageStandards().begin();
      it != target->GetMaxLanguageStandards().end(); ++it)
    {
    const char* standard = target->GetProperty(it->first + "_STANDARD");
    if(!standard)
      {
      continue;
      }
    if (this->Makefile->IsLaterStandard(it->first, standard, it->second))
      {
      std::ostringstream e;
      e << "The COMPILE_FEATURES property of target \""
        << target->GetName() << "\" was evaluated when computing the link "
        "implementation, and the \"" << it->first << "_STANDARD\" was \""
        << it->second << "\" for that computation.  Computing the "
        "COMPILE_FEATURES based on the link implementation resulted in a "
        "higher \"" << it->first << "_STANDARD\" \"" << standard << "\".  "
        "This is not permitted. The COMPILE_FEATURES may not both depend on "
        "and be depended on by the link implementation." << std::endl;
      this->IssueMessage(cmake::FATAL_ERROR, e.str());
      return;
      }
    }
  this->AddCompilerRequirementFlag(flags, target, lang);
}